

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O1

void __thiscall pbrt::SDVertex::oneRing(SDVertex *this,Point3f *p)

{
  SDVertex *pSVar1;
  float fVar2;
  int iVar3;
  SDFace *face;
  SDFace *this_00;
  Point3f *pPVar4;
  SDFace *this_01;
  
  this_00 = this->startFace;
  if (this->boundary == false) {
    do {
      iVar3 = SDFace::vnum(this_00,this);
      pSVar1 = this_00->v[iVar3 + 1 + ((iVar3 + 1) / 3) * -3];
      fVar2 = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.y;
      (p->super_Tuple3<pbrt::Point3,_float>).x = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.x;
      (p->super_Tuple3<pbrt::Point3,_float>).y = fVar2;
      (p->super_Tuple3<pbrt::Point3,_float>).z = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
      iVar3 = SDFace::vnum(this_00,this);
      this_00 = this_00->f[iVar3];
      p = p + 1;
    } while (this_00 != this->startFace);
  }
  else {
    do {
      this_01 = this_00;
      iVar3 = SDFace::vnum(this_01,this);
      this_00 = this_01->f[iVar3];
    } while (this_01->f[iVar3] != (SDFace *)0x0);
    iVar3 = SDFace::vnum(this_01,this);
    pSVar1 = this_01->v[iVar3 + 1 + ((iVar3 + 1) / 3) * -3];
    fVar2 = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.y;
    (p->super_Tuple3<pbrt::Point3,_float>).x = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.x;
    (p->super_Tuple3<pbrt::Point3,_float>).y = fVar2;
    (p->super_Tuple3<pbrt::Point3,_float>).z = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
    pPVar4 = p + 1;
    do {
      iVar3 = SDFace::vnum(this_01,this);
      pSVar1 = this_01->v[iVar3 + 2 + ((iVar3 + 2) / 3) * -3];
      fVar2 = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.y;
      (pPVar4->super_Tuple3<pbrt::Point3,_float>).x =
           (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.x;
      (pPVar4->super_Tuple3<pbrt::Point3,_float>).y = fVar2;
      (pPVar4->super_Tuple3<pbrt::Point3,_float>).z =
           (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
      iVar3 = SDFace::vnum(this_01,this);
      this_01 = this_01->f[iVar3 + 2 + ((iVar3 + 2) / 3) * -3];
      pPVar4 = pPVar4 + 1;
    } while (this_01 != (SDFace *)0x0);
  }
  return;
}

Assistant:

void SDVertex::oneRing(Point3f *p) {
    if (!boundary) {
        // Get one-ring vertices for interior vertex
        SDFace *face = startFace;
        do {
            *p++ = face->nextVert(this)->p;
            face = face->nextFace(this);
        } while (face != startFace);
    } else {
        // Get one-ring vertices for boundary vertex
        SDFace *face = startFace, *f2;
        while ((f2 = face->nextFace(this)) != nullptr)
            face = f2;
        *p++ = face->nextVert(this)->p;
        do {
            *p++ = face->prevVert(this)->p;
            face = face->prevFace(this);
        } while (face != nullptr);
    }
}